

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

fio_protocol_s *
http1_new(uintptr_t uuid,http_settings_s *settings,void *unread_data,size_t unread_length)

{
  uint8_t uVar1;
  fio_protocol_s *protocol;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var2;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var3;
  int *piVar4;
  timespec tVar5;
  
  if (unread_data == (void *)0x0 || unread_length < 0x2001) {
    protocol = (fio_protocol_s *)fio_malloc(0x2108);
    if (protocol == (fio_protocol_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http1.c:801"
                      );
      }
      kill(0,2);
      piVar4 = __errno_location();
      exit(*piVar4);
    }
    p_Var2 = (_func_void_intptr_t_fio_protocol_s_ptr *)settings->max_header_size;
    uVar1 = settings->is_client;
    protocol->on_data = http1_on_data_first_time;
    protocol->on_ready = http1_on_ready;
    protocol->on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol->on_close = http1_on_close;
    protocol->ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol->rsv = 0;
    protocol[1].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)uuid;
    protocol[1].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)settings;
    memset(&protocol[1].on_shutdown,0,0xb0);
    protocol[5].on_data = p_Var2;
    protocol[5].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    *(undefined1 *)&protocol[5].on_shutdown = 0;
    *(uint8_t *)((long)&protocol[5].on_shutdown + 1) = uVar1;
    *(undefined4 *)((long)&protocol[5].on_shutdown + 2) = 0;
    *(undefined2 *)((long)&protocol[5].on_shutdown + 6) = 0;
    p_Var2 = (_func_void_intptr_t_fio_protocol_s_ptr *)fiobj_hash_new();
    tVar5 = fio_last_tick();
    p_Var3 = (_func_void_intptr_t_fio_protocol_s_ptr *)fiobj_hash_new();
    protocol[2].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)&HTTP1_VTABLE;
    protocol[2].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)protocol;
    protocol[2].on_close = p_Var2;
    protocol[2].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)tVar5.tv_sec;
    protocol[2].rsv = tVar5.tv_nsec;
    protocol[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[3].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0xc8;
    protocol[3].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[3].rsv = 0;
    protocol[4].on_data = p_Var3;
    protocol[4].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[4].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[4].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    protocol[4].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    if (unread_length < 0x2001 && unread_data != (void *)0x0) {
      memcpy((void *)((long)&protocol[5].on_shutdown + 3),unread_data,unread_length);
      protocol[4].rsv = unread_length;
      fio_attach(uuid,protocol);
      fio_force_event(uuid,FIO_EVENT_ON_DATA);
    }
    else {
      fio_attach(uuid,protocol);
    }
  }
  else {
    protocol = (fio_protocol_s *)0x0;
  }
  return protocol;
}

Assistant:

fio_protocol_s *http1_new(uintptr_t uuid, http_settings_s *settings,
                          void *unread_data, size_t unread_length) {
  if (unread_data && unread_length > HTTP_MAX_HEADER_LENGTH)
    return NULL;
  http1pr_s *p = fio_malloc(sizeof(*p) + HTTP_MAX_HEADER_LENGTH);
  // FIO_LOG_DEBUG("Allocated HTTP/1.1 protocol at. %p", (void *)p);
  FIO_ASSERT_ALLOC(p);
  *p = (http1pr_s){
      .p.protocol =
          {
              .on_data = http1_on_data_first_time,
              .on_close = http1_on_close,
              .on_ready = http1_on_ready,
          },
      .p.uuid = uuid,
      .p.settings = settings,
      .max_header_size = settings->max_header_size,
      .is_client = settings->is_client,
  };
  http_s_new(&p->request, &p->p, &HTTP1_VTABLE);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    memcpy(p->buf, unread_data, unread_length);
    p->buf_len = unread_length;
  }
  fio_attach(uuid, &p->p.protocol);
  if (unread_data && unread_length <= HTTP_MAX_HEADER_LENGTH) {
    fio_force_event(uuid, FIO_EVENT_ON_DATA);
  }
  return &p->p.protocol;
}